

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_test.cpp
# Opt level: O2

void __thiscall Spectrum_SamplingPdfXYZ_Test::TestBody(Spectrum_SamplingPdfXYZ_Test *this)

{
  int iVar1;
  char *message;
  undefined1 auVar2 [16];
  Float FVar3;
  Float FVar4;
  Float FVar5;
  Float FVar6;
  Float FVar7;
  Float FVar8;
  Float FVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float local_74;
  Stratified1DIter __begin1;
  Stratified1DIter __end1;
  AssertionResult gtest_ar;
  
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0x27;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pbrt::detail::IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter>::begin
            (&__begin1,
             (IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter> *)&gtest_ar);
  pbrt::detail::IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter>::end
            (&__end1,(IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter> *)
                     &gtest_ar);
  fVar11 = 0.0;
  local_74 = 0.0;
  iVar1 = __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
          super_IndexingIterator<pbrt::detail::Stratified1DIter>.i;
  while (iVar1 != __end1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
                  super_IndexingIterator<pbrt::detail::Stratified1DIter>.i) {
    FVar3 = pbrt::detail::Stratified1DIter::operator*(&__begin1);
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)(FVar3 * 830.0)),ZEXT416((uint)(1.0 - FVar3)),
                             ZEXT416(0x43b40000));
    FVar6 = auVar2._0_4_;
    FVar4 = pbrt::DenselySampledSpectrum::operator()(pbrt::Spectra::x,FVar6);
    FVar5 = pbrt::DenselySampledSpectrum::operator()(pbrt::Spectra::y,FVar6);
    FVar6 = pbrt::DenselySampledSpectrum::operator()(pbrt::Spectra::z,FVar6);
    FVar3 = pbrt::SampleXYZMatching(FVar3);
    FVar7 = pbrt::XYZMatchingPDF(FVar3);
    if (0.0 < FVar7) {
      FVar8 = pbrt::DenselySampledSpectrum::operator()(pbrt::Spectra::x,FVar3);
      FVar9 = pbrt::DenselySampledSpectrum::operator()(pbrt::Spectra::y,FVar3);
      FVar3 = pbrt::DenselySampledSpectrum::operator()(pbrt::Spectra::z,FVar3);
      local_74 = local_74 + (FVar3 + FVar9 + FVar8) / FVar7;
    }
    fVar11 = fVar11 + (FVar6 + FVar5 + FVar4) / 0.0021276595;
    iVar1 = __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
            super_IndexingIterator<pbrt::detail::Stratified1DIter>.i + 1;
    __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
    super_IndexingIterator<pbrt::detail::Stratified1DIter>.i = iVar1;
  }
  __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
  super_IndexingIterator<pbrt::detail::Stratified1DIter>.i = -0x2d0e5604;
  __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
  super_IndexingIterator<pbrt::detail::Stratified1DIter>.n = 0x3f50624d;
  fVar11 = fVar11 / 10000.0;
  auVar10._0_4_ = (local_74 / 10000.0 - fVar11) / fVar11;
  auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar2._8_4_ = 0x7fffffff;
  auVar2._0_8_ = 0x7fffffff7fffffff;
  auVar2._12_4_ = 0x7fffffff;
  auVar2 = vandps_avx512vl(auVar10,auVar2);
  __end1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
  super_IndexingIterator<pbrt::detail::Stratified1DIter>.i = auVar2._0_4_;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&gtest_ar,"std::abs((impInt - unifInt) / unifInt)","1e-3",(float *)&__end1,
             (double *)&__begin1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&__begin1);
    std::ostream::operator<<
              ((void *)((long)__begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
                              super_IndexingIterator<pbrt::detail::Stratified1DIter> + 0x10),
               local_74 / 10000.0);
    std::operator<<((ostream *)
                    ((long)__begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
                           super_IndexingIterator<pbrt::detail::Stratified1DIter> + 0x10)," vs. ");
    std::ostream::operator<<
              ((void *)((long)__begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
                              super_IndexingIterator<pbrt::detail::Stratified1DIter> + 0x10),fVar11)
    ;
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__end1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/spectrum_test.cpp"
               ,0xa2,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__end1,(Message *)&__begin1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__end1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&__begin1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(Spectrum, SamplingPdfXYZ) {
    // Make sure we can integrate the sum of the x+y+z matching curves correctly
    Float impSum = 0, unifSum = 0;
    int n = 10000;
    for (Float u : Stratified1D(n)) {
        {
            // Uniform
            Float lambda = Lerp(u, Lambda_min, Lambda_max);
            Float pdf = 1. / (Lambda_max - Lambda_min);
            unifSum +=
                (Spectra::X()(lambda) + Spectra::Y()(lambda) + Spectra::Z()(lambda)) /
                pdf;
        }

        Float lambda = SampleXYZMatching(u);
        Float pdf = XYZMatchingPDF(lambda);
        if (pdf > 0)
            impSum +=
                (Spectra::X()(lambda) + Spectra::Y()(lambda) + Spectra::Z()(lambda)) /
                pdf;
    }
    Float impInt = impSum / n, unifInt = unifSum / n;

    EXPECT_LT(std::abs((impInt - unifInt) / unifInt), 1e-3)
        << impInt << " vs. " << unifInt;
}